

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instr_set_test.cpp
# Opt level: O2

void __thiscall instr_set_test_main_Test::instr_set_test_main_Test(instr_set_test_main_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00178830;
  return;
}

Assistant:

TEST(instr_set_test, main) {
  using test_traits = instr_set_traits<test_instr_set>;
  using test_traits2 = instr_set_traits<test_instr_set2>;

  static_assert(
      std::is_same_v<num::little_endian_tag, typename test_traits::endian_type>,
      "[-][instr_set_test] bad endianness");

  static_assert(std::is_same_v<test_traits::set_stack_type, list::mplist<ui32>>,
                "[-][instr_set_test] bad vstack types");
  static_assert(
      std::is_same_v<test_traits2::set_stack_type, list::mplist<double, ui32>>,
      "[-][instr_set_test] bad vstack types");

  static_assert(
      std::is_same_v<list::at_t<0, test_instr_set::instr_table>::bytecode_type,
                     list::mplist<>>,
      "[-][instr_set_test] bad code types");
  static_assert(
      std::is_same_v<list::at_t<1, test_instr_set::instr_table>::bytecode_type,
                     list::mplist<ui32>>,
      "[-][instr_set_test] bad code types");

  EXPECT_STREQ(test_traits::instr_names[0], "zero");
  EXPECT_STREQ(test_traits::instr_names[1], "jump");
  EXPECT_STREQ(test_traits::instr_names[2], "dup");
  EXPECT_STREQ(test_traits::instr_names[3], "push");
  EXPECT_STREQ(test_traits::instr_names[4], "randn");
  EXPECT_STREQ(test_traits::instr_names[5], "rotln");
  EXPECT_STREQ(test_traits::instr_names[6], "add");
}